

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O2

string_t __thiscall
duckdb::CaseConvertOperator<true>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperator<true> *this,string_t input,Vector *result)

{
  undefined1 auVar1 [16];
  int32_t iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  StringVector *len;
  StringVector *extraout_RDX;
  char *pcVar6;
  ulong uVar7;
  char *c;
  Vector *vector;
  int local_60;
  int sz;
  anon_union_16_2_67f50693_for_value local_58;
  StringVector *local_48;
  string_t input_local;
  
  len = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar6 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar6 = input_local.value.pointer.prefix;
  }
  vector = (Vector *)0x0;
  local_48 = len;
  input_local.value._0_8_ = this;
  for (uVar7 = 0; uVar7 < ((ulong)this & 0xffffffff); uVar7 = uVar7 + lVar4) {
    lVar4 = 1;
    lVar5 = 1;
    if (pcVar6[uVar7] < '\0') {
      auVar1._12_4_ = 0;
      auVar1[0] = local_58.pointer.prefix[0];
      auVar1[1] = local_58.pointer.prefix[1];
      auVar1[2] = local_58.pointer.prefix[2];
      auVar1[3] = local_58.pointer.prefix[3];
      auVar1[4] = local_58.inlined.inlined[4];
      auVar1[5] = local_58.inlined.inlined[5];
      auVar1[6] = local_58.inlined.inlined[6];
      auVar1[7] = local_58.inlined.inlined[7];
      auVar1[8] = local_58.inlined.inlined[8];
      auVar1[9] = local_58.inlined.inlined[9];
      auVar1[10] = local_58.inlined.inlined[10];
      auVar1[0xb] = local_58.inlined.inlined[0xb];
      local_58 = (anon_union_16_2_67f50693_for_value)(auVar1 << 0x20);
      iVar2 = Utf8Proc::UTF8ToCodepoint(pcVar6 + uVar7,(int *)&local_58);
      iVar2 = Utf8Proc::CodepointToUpper(iVar2);
      iVar3 = Utf8Proc::CodepointLength(iVar2);
      lVar5 = (long)iVar3;
      lVar4 = (long)(int)local_58.pointer.length;
      len = extraout_RDX;
    }
    vector = (Vector *)(&vector->vector_type + lVar5);
  }
  local_58.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringVector::EmptyString(local_48,vector,(idx_t)len);
  c = local_58._8_8_;
  if (local_58._0_4_ < 0xd) {
    c = local_58.pointer.prefix;
  }
  for (uVar7 = 0; uVar7 < ((ulong)this & 0xffffffff); uVar7 = uVar7 + lVar4) {
    if ((long)pcVar6[uVar7] < 0) {
      sz = 0;
      local_60 = 0;
      iVar2 = Utf8Proc::UTF8ToCodepoint(pcVar6 + uVar7,&sz);
      iVar2 = Utf8Proc::CodepointToUpper(iVar2);
      Utf8Proc::CodepointToUtf8(iVar2,&local_60,c);
      c = c + local_60;
      lVar4 = (long)sz;
    }
    else {
      *c = StringUtil::ASCII_TO_UPPER_MAP[pcVar6[uVar7]];
      c = c + 1;
      lVar4 = 1;
    }
  }
  string_t::Finalize((string_t *)&local_58.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_58.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return UnicodeCaseConvert<IS_UPPER>(result, input_data, input_length);
	}